

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::EmitAddtlInfo_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo
               (SnapObject *snpObject,FileWriter *writer)

{
  SnapPromiseAllSettledResolveOrRejectElementFunctionInfo *capabilityInfo;
  
  capabilityInfo =
       SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)32>
                 (snpObject);
  (*writer->_vptr_FileWriter[3])(writer,3,1);
  NSSnapValues::EmitPromiseCapabilityInfo(&capabilityInfo->Capabilities,writer,NoSeparator);
  FileWriter::WriteUInt32(writer,u32Val,capabilityInfo->Index,CommaSeparator);
  FileWriter::WriteAddr(writer,ptrIdVal,capabilityInfo->RemainingElementsWrapperId,CommaSeparator);
  FileWriter::WriteUInt32(writer,u32Val,capabilityInfo->RemainingElementsValue,CommaSeparator);
  FileWriter::WriteAddr(writer,ptrIdVal,capabilityInfo->AlreadyCalledWrapperId,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)capabilityInfo->AlreadyCalledValue,1);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)capabilityInfo->IsRejecting,1);
  FileWriter::WriteAddr(writer,ptrIdVal,capabilityInfo->Values,CommaSeparator);
  return;
}

Assistant:

void EmitAddtlInfo_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapPromiseAllSettledResolveOrRejectElementFunctionInfo* aInfo = SnapObjectGetAddtlInfoAs<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*, SnapObjectType::SnapPromiseAllSettledResolveOrRejectElementFunctionObject>(snpObject);

            writer->WriteKey(NSTokens::Key::entry, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitPromiseCapabilityInfo(&aInfo->Capabilities, writer, NSTokens::Separator::NoSeparator);

            writer->WriteUInt32(NSTokens::Key::u32Val, aInfo->Index, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::ptrIdVal, aInfo->RemainingElementsWrapperId, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::u32Val, aInfo->RemainingElementsValue, NSTokens::Separator::CommaSeparator);

            writer->WriteAddr(NSTokens::Key::ptrIdVal, aInfo->AlreadyCalledWrapperId, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::boolVal, aInfo->AlreadyCalledValue, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, aInfo->IsRejecting, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::ptrIdVal, aInfo->Values, NSTokens::Separator::CommaSeparator);
        }